

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QKmsPlane>::emplace<QKmsPlane_const&>
          (QGenericArrayOps<QKmsPlane> *this,qsizetype i,QKmsPlane *args)

{
  QKmsPlane **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_e8;
  QKmsPlane tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<QKmsPlane>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<QKmsPlane>).size == i) {
      qVar5 = QArrayDataPointer<QKmsPlane>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<QKmsPlane>);
      if (qVar5 == 0) goto LAB_00132f17;
      QKmsPlane::QKmsPlane
                ((this->super_QArrayDataPointer<QKmsPlane>).ptr +
                 (this->super_QArrayDataPointer<QKmsPlane>).size,args);
LAB_00133042:
      pqVar2 = &(this->super_QArrayDataPointer<QKmsPlane>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00132ffb;
    }
LAB_00132f17:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QKmsPlane>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<QKmsPlane>);
      if (qVar5 != 0) {
        QKmsPlane::QKmsPlane((this->super_QArrayDataPointer<QKmsPlane>).ptr + -1,args);
        ppQVar1 = &(this->super_QArrayDataPointer<QKmsPlane>).ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_00133042;
      }
    }
  }
  tmp._96_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._80_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._88_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.supportedFormats.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.supportedFormats.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.supportedFormats.d.ptr = (uint *)&DAT_aaaaaaaaaaaaaaaa;
  tmp._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QKmsPlane::QKmsPlane(&tmp,args);
  bVar6 = (this->super_QArrayDataPointer<QKmsPlane>).size != 0;
  QArrayDataPointer<QKmsPlane>::detachAndGrow
            (&this->super_QArrayDataPointer<QKmsPlane>,(uint)(i == 0 && bVar6),1,(QKmsPlane **)0x0,
             (QArrayDataPointer<QKmsPlane> *)0x0);
  if (i == 0 && bVar6) {
    QKmsPlane::QKmsPlane((this->super_QArrayDataPointer<QKmsPlane>).ptr + -1,&tmp);
    ppQVar1 = &(this->super_QArrayDataPointer<QKmsPlane>).ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<QKmsPlane>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_e8.sourceCopyConstruct = 0;
    local_e8.nSource = 0;
    local_e8.move = 0;
    local_e8.sourceCopyAssign = 0;
    local_e8.end = (QKmsPlane *)0x0;
    local_e8.last = (QKmsPlane *)0x0;
    local_e8.where = (QKmsPlane *)0x0;
    local_e8.begin = (this->super_QArrayDataPointer<QKmsPlane>).ptr;
    local_e8.size = (this->super_QArrayDataPointer<QKmsPlane>).size;
    local_e8.data = &this->super_QArrayDataPointer<QKmsPlane>;
    Inserter::insertOne(&local_e8,i,&tmp);
    (local_e8.data)->ptr = local_e8.begin;
    (local_e8.data)->size = local_e8.size;
  }
  QArrayDataPointer<unsigned_int>::~QArrayDataPointer(&tmp.supportedFormats.d);
LAB_00132ffb:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }